

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O0

Lazy<cinatra::resp_data> __thiscall
cinatra::coro_http_client::write_websocket(coro_http_client *this,char *data,opcode op)

{
  bool bVar1;
  undefined8 *puVar2;
  undefined8 *extraout_RAX;
  undefined8 *extraout_RAX_00;
  undefined1 in_CL;
  undefined8 in_RDX;
  undefined8 in_RSI;
  LazyBase<cinatra::resp_data,_false> in_RDI;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  undefined4 in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  void *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  int local_208;
  undefined4 in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe04;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe10;
  allocator<char> local_b9 [80];
  opcode in_stack_ffffffffffffff97;
  string *in_stack_ffffffffffffff98;
  coro_http_client *in_stack_ffffffffffffffa0;
  
  puVar2 = (undefined8 *)operator_new(0xf8,(nothrow_t *)&std::nothrow);
  if (puVar2 == (undefined8 *)0x0) {
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
    get_return_object_on_allocation_failure();
  }
  else {
    *puVar2 = write_websocket;
    puVar2[1] = write_websocket;
    puVar2[0x1d] = in_RSI;
    puVar2[0x19] = in_RDX;
    *(undefined1 *)((long)puVar2 + 0xf5) = in_CL;
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::LazyPromise
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
    async_simple::coro::detail::LazyPromise<cinatra::resp_data>::get_return_object
              ((LazyPromise<cinatra::resp_data> *)
               CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    async_simple::coro::detail::LazyPromiseBase::initial_suspend((LazyPromiseBase *)(puVar2 + 2));
    bVar1 = std::suspend_always::await_ready((suspend_always *)((long)puVar2 + 0xf6));
    if (bVar1) {
      std::suspend_always::await_resume((suspend_always *)((long)puVar2 + 0xf6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffe10,
                 (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00));
      std::allocator<char>::~allocator(local_b9);
      write_websocket(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff97)
      ;
      async_simple::coro::detail::LazyPromiseBase::
      await_transform<async_simple::coro::Lazy<cinatra::resp_data>>
                ((LazyPromiseBase *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
                 (Lazy<cinatra::resp_data> *)
                 CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
      bVar1 = async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::await_ready
                        ((LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x1b));
      if (bVar1) {
        puVar2[0x18] = (LazyAwaiterBase<cinatra::resp_data> *)(puVar2 + 0x1b);
        async_simple::coro::detail::LazyAwaiterBase<cinatra::resp_data>::awaitResume
                  ((LazyAwaiterBase<cinatra::resp_data> *)in_stack_fffffffffffffe10);
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::
        return_value<cinatra::resp_data>
                  ((LazyPromise<cinatra::resp_data> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
                   (resp_data *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
        async_simple::coro::detail::LazyBase<cinatra::resp_data,_false>::ValueAwaiter::~ValueAwaiter
                  ((ValueAwaiter *)0x437499);
        async_simple::coro::Lazy<cinatra::resp_data>::~Lazy((Lazy<cinatra::resp_data> *)0x4374a6);
        local_208 = 3;
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0));
        if (local_208 == 3) {
          async_simple::coro::detail::LazyPromiseBase::final_suspend
                    ((LazyPromiseBase *)(puVar2 + 2));
          bVar1 = async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_ready
                            ((FinalAwaiter *)((long)puVar2 + 0xf7));
          if (!bVar1) {
            *puVar2 = 0;
            *(undefined1 *)((long)puVar2 + 0xf4) = 2;
            write_websocket(in_stack_fffffffffffffde0,
                            (void *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
            (*(code *)*extraout_RAX_00)(extraout_RAX_00);
            return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_.__handle_;
          }
          async_simple::coro::detail::LazyPromiseBase::FinalAwaiter::await_resume
                    ((FinalAwaiter *)((long)puVar2 + 0xf7));
        }
        async_simple::coro::detail::LazyPromise<cinatra::resp_data>::~LazyPromise
                  ((LazyPromise<cinatra::resp_data> *)0x437668);
        if (puVar2 != (undefined8 *)0x0) {
          operator_delete(puVar2,0xf8);
        }
      }
      else {
        *(undefined1 *)((long)puVar2 + 0xf4) = 1;
        write_websocket((void *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                        (void *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        (*(code *)*extraout_RAX)(extraout_RAX);
      }
    }
    else {
      *(undefined1 *)((long)puVar2 + 0xf4) = 0;
      write_websocket(in_stack_fffffffffffffde0,
                      (void *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    }
  }
  return (Lazy<cinatra::resp_data>)in_RDI._coro.__handle_;
}

Assistant:

async_simple::coro::Lazy<resp_data> write_websocket(
      const char *data, opcode op = opcode::text) {
    std::string str(data);
    co_return co_await write_websocket(str, op);
  }